

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O0

CodeWord ZXing::Pdf417::ReadCodeWord<ZXing::PointT<double>>
                   (BitMatrixCursor<ZXing::PointT<double>_> *cur,int expectedCluster)

{
  PointT<double> o;
  bool bVar1;
  BitMatrixCursor<ZXing::PointT<double>_> *pBVar2;
  BitMatrixCursor<ZXing::PointT<double>_> *this;
  void *in_RDI;
  PointT<double> PVar3;
  this_t curAlt;
  PointT<double> offset;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<ZXing::PointT<double>_> *__range3;
  CodeWord cw;
  BitMatrixCursor<ZXing::PointT<double>_> curBackup;
  anon_class_4_1_5471c602 readCodeWord;
  CodeWord cwAlt;
  initializer_list<ZXing::PointT<double>_> *in_stack_ffffffffffffff30;
  BitMatrixCursor<ZXing::PointT<double>_> *this_00;
  undefined1 local_c8 [40];
  BitMatrix *local_a0;
  BitMatrixCursor<ZXing::PointT<double>_> *local_98;
  double dVar4;
  undefined1 in_stack_ffffffffffffff90 [16];
  initializer_list<ZXing::PointT<double>_> local_60;
  initializer_list<ZXing::PointT<double>_> *local_50;
  CodeWord local_48;
  undefined1 local_40 [48];
  void *local_10;
  CodeWord local_8;
  
  local_10 = in_RDI;
  memcpy(local_40,in_RDI,0x28);
  local_48 = ReadCodeWord<ZXing::PointT<double>>(ZXing::BitMatrixCursor<ZXing::PointT<double>>&,int)
             ::{lambda(auto:1&)#1}::operator()
                       (in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_);
  bVar1 = CodeWord::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    PVar3 = BitMatrixCursor<ZXing::PointT<double>_>::left
                      ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2ce5ed);
    dVar4 = PVar3.x;
    PVar3 = BitMatrixCursor<ZXing::PointT<double>_>::right
                      ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2ce606);
    local_60._M_array = (iterator)&stack0xffffffffffffff80;
    local_60._M_len = 2;
    local_50 = &local_60;
    pBVar2 = (BitMatrixCursor<ZXing::PointT<double>_> *)
             std::initializer_list<ZXing::PointT<double>_>::begin(local_50);
    this = (BitMatrixCursor<ZXing::PointT<double>_> *)
           std::initializer_list<ZXing::PointT<double>_>::end(in_stack_ffffffffffffff30);
    for (; pBVar2 != this; pBVar2 = (BitMatrixCursor<ZXing::PointT<double>_> *)&(pBVar2->p).y) {
      local_a0 = pBVar2->img;
      this_00 = (BitMatrixCursor<ZXing::PointT<double>_> *)(pBVar2->p).x;
      o.y = dVar4;
      o.x = (double)pBVar2;
      local_98 = this_00;
      BitMatrixCursor<ZXing::PointT<double>_>::movedBy(this,o);
      bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(this_00);
      if (bVar1) {
        local_8 = ReadCodeWord<ZXing::PointT<double>>(ZXing::BitMatrixCursor<ZXing::PointT<double>>&,int)
                  ::{lambda(auto:1&)#1}::operator()
                            ((anon_class_4_1_5471c602 *)PVar3.y,
                             (BitMatrixCursor<ZXing::PointT<double>_> *)PVar3.x);
        bVar1 = CodeWord::operator_cast_to_bool(&local_8);
        if (bVar1) {
          memcpy(local_10,local_c8,0x28);
          return local_8;
        }
      }
    }
  }
  return local_48;
}

Assistant:

CodeWord ReadCodeWord(BitMatrixCursor<POINT>& cur, int expectedCluster = -1)
{
	auto readCodeWord = [expectedCluster](auto& cur) -> CodeWord {
		auto np     = NormalizedPattern<8, 17>(cur.template readPattern<Pattern417>());
		int cluster = (np[0] - np[2] + np[4] - np[6] + 9) % 9;
		int code = expectedCluster == -1 || cluster == expectedCluster ? CodewordDecoder::GetCodeword(ToInt(np)) : -1;

		return {cluster, code};
	};

	auto curBackup = cur;
	auto cw = readCodeWord(cur);
	if (!cw) {
		for (auto offset : {curBackup.left(), curBackup.right()}) {
			auto curAlt = curBackup.movedBy(offset);
			if (!curAlt.isIn()) // curBackup might be the first or last image row
				continue;
			if (auto cwAlt = readCodeWord(curAlt)) {
				cur = curAlt;
				return cwAlt;
			}
		}
	}
	return cw;
}